

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O0

int testDynamicLoader(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_40 [8];
  string libname;
  int res;
  char **argv_local;
  int argc_local;
  
  libname.field_2._12_4_ = 0;
  if (argc == 3) {
    argv_local._4_4_ = TestDynamicLoader(argv[1],argv[2],1,1,1);
  }
  else {
    iVar1 = TestDynamicLoader("azerty_","foo_bar",0,0,0);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    iVar1 = TestDynamicLoader("/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/kwsys/testSystemTools.bin"
                              ,"wp",0,0,0);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    iVar1 = TestDynamicLoader("foobar.lib","dlopen",0,1,0);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    iVar1 = TestDynamicLoader("libdl.so","dlopen",1,1,1);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    iVar1 = TestDynamicLoader("libdl.so","TestDynamicLoader",1,0,1);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    GetLibName_abi_cxx11_((string *)local_40,"cmsysTestDynload");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = TestDynamicLoader(pcVar2,"dummy",1,0,1);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = TestDynamicLoader(pcVar2,"TestDynamicLoaderSymbolPointer",1,1,1);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = TestDynamicLoader(pcVar2,"_TestDynamicLoaderSymbolPointer",1,0,1);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = TestDynamicLoader(pcVar2,"TestDynamicLoaderData",1,1,1);
    libname.field_2._12_4_ = libname.field_2._12_4_ + iVar1;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = TestDynamicLoader(pcVar2,"_TestDynamicLoaderData",1,0,1);
    argv_local._4_4_ = iVar1 + libname.field_2._12_4_;
    libname.field_2._12_4_ = argv_local._4_4_;
    std::__cxx11::string::~string((string *)local_40);
  }
  return argv_local._4_4_;
}

Assistant:

int testDynamicLoader(int argc, char *argv[])
{
#if defined(_WIN32)
  SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#elif defined(__BEOS__) || defined(__HAIKU__)
  disable_debugger(1);
#endif
  int res = 0;
  if( argc == 3 )
    {
    // User specify a libname and symbol to check.
    res = TestDynamicLoader(argv[1], argv[2],1,1,1);
    return res;
    }

// dlopen() on Syllable before 11/22/2007 doesn't return 0 on error
#ifndef __SYLLABLE__
  // Make sure that inexistent lib is giving correct result
  res += TestDynamicLoader("azerty_", "foo_bar",0,0,0);
  // Make sure that random binary file cannot be assimilated as dylib
  res += TestDynamicLoader(TEST_SYSTEMTOOLS_SOURCE_DIR "/testSystemTools.bin", "wp",0,0,0);
#endif

#ifdef __linux__
  // This one is actually fun to test, since dlopen is by default loaded...wonder why :)
  res += TestDynamicLoader("foobar.lib", "dlopen",0,1,0);
  res += TestDynamicLoader("libdl.so", "dlopen",1,1,1);
  res += TestDynamicLoader("libdl.so", "TestDynamicLoader",1,0,1);
#endif
  // Now try on the generated library
  std::string libname = GetLibName(KWSYS_NAMESPACE_STRING "TestDynload");
  res += TestDynamicLoader(libname.c_str(), "dummy",1,0,1);
  res += TestDynamicLoader(libname.c_str(), "TestDynamicLoaderSymbolPointer",1,1,1);
  res += TestDynamicLoader(libname.c_str(), "_TestDynamicLoaderSymbolPointer",1,0,1);
  res += TestDynamicLoader(libname.c_str(), "TestDynamicLoaderData",1,1,1);
  res += TestDynamicLoader(libname.c_str(), "_TestDynamicLoaderData",1,0,1);

  return res;
}